

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int pkey_gost_mac_signctx(EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,EVP_MD_CTX *mctx)

{
  void *pvVar1;
  EVP_MD *pEVar2;
  code *pcVar3;
  EVP_MD_CTX *in_RCX;
  long *in_RDX;
  uchar *in_RSI;
  EVP_PKEY_CTX *in_RDI;
  gost_mac_pmeth_data *data;
  int ret;
  uint tmpsiglen;
  uint local_2c;
  EVP_MD_CTX *local_28;
  long *local_20;
  uchar *local_18;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pvVar1 = EVP_PKEY_CTX_get_data(in_RDI);
  if (local_20 == (long *)0x0) {
    local_4 = 0;
  }
  else {
    local_2c = (uint)*local_20;
    if (local_18 == (uchar *)0x0) {
      *local_20 = (long)*(short *)((long)pvVar1 + 2);
      local_4 = 1;
    }
    else {
      pEVar2 = EVP_MD_CTX_md(local_28);
      pcVar3 = (code *)EVP_MD_meth_get_ctrl(pEVar2);
      (*pcVar3)(local_28,3,(int)*(short *)((long)pvVar1 + 2),0);
      local_4 = EVP_DigestFinal_ex(local_28,local_18,&local_2c);
      *local_20 = (long)*(short *)((long)pvVar1 + 2);
    }
  }
  return local_4;
}

Assistant:

static int pkey_gost_mac_signctx(EVP_PKEY_CTX *ctx, unsigned char *sig,
                                 size_t *siglen, EVP_MD_CTX *mctx)
{
    unsigned int tmpsiglen;
    int ret;
    struct gost_mac_pmeth_data *data = EVP_PKEY_CTX_get_data(ctx);

    if (!siglen)
        return 0;
    tmpsiglen = *siglen;        /* for platforms where sizeof(int) !=
                                 * sizeof(size_t) */

    if (!sig) {
        *siglen = data->mac_size;
        return 1;
    }

    EVP_MD_meth_get_ctrl(EVP_MD_CTX_md(mctx))
        (mctx, EVP_MD_CTRL_XOF_LEN, data->mac_size, NULL);
    ret = EVP_DigestFinal_ex(mctx, sig, &tmpsiglen);
    *siglen = data->mac_size;
    return ret;
}